

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

bool __thiscall QHttpNetworkReplyPrivate::expectContent(QHttpNetworkReplyPrivate *this)

{
  int iVar1;
  Operation OVar2;
  qint64 qVar3;
  
  iVar1 = QHttpHeaderParser::getStatusCode(&(this->super_QHttpNetworkHeaderPrivate).parser);
  if (99 < iVar1 - 100U) {
    if (iVar1 == 0xcc) {
      return false;
    }
    if (iVar1 == 0x130) {
      return false;
    }
    OVar2 = QHttpNetworkRequest::operation(&this->request);
    if (((OVar2 != Head) &&
        (qVar3 = QHttpNetworkHeaderPrivate::contentLength(&this->super_QHttpNetworkHeaderPrivate),
        qVar3 != 0)) && ((qVar3 != -1 || (this->bodyLength != 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool QHttpNetworkReplyPrivate::expectContent()
{
    int statusCode = parser.getStatusCode();
    // check whether we can expect content after the headers (rfc 2616, sec4.4)
    if ((statusCode >= 100 && statusCode < 200)
        || statusCode == 204 || statusCode == 304)
        return false;
    if (request.operation() == QHttpNetworkRequest::Head)
        return false; // no body expected for HEAD request
    qint64 expectedContentLength = contentLength();
    if (expectedContentLength == 0)
        return false;
    if (expectedContentLength == -1 && bodyLength == 0) {
        // The content-length header was stripped, but its value was 0.
        // This would be the case for an explicitly zero-length compressed response.
        return false;
    }
    return true;
}